

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

int __thiscall filtered_union_find::link(filtered_union_find *this,char *__from,char *__to)

{
  float fVar1;
  bool bVar2;
  const_reference __n;
  const_reference __n_00;
  const_reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  size_type *psVar7;
  vector<long,std::allocator<long>> *pvVar8;
  iterator iVar9;
  iterator iVar10;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_a0;
  const_iterator local_98;
  size_type local_90;
  long i_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_58;
  const_iterator local_50;
  size_type local_48;
  long i;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  index_t y_local;
  index_t x_local;
  filtered_union_find *this_local;
  
  __n = (const_reference)find(this,(index_t)__from);
  __n_00 = (const_reference)find(this,(index_t)__to);
  if (__n == __n_00) goto LAB_00189e57;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->filtration,(size_type)__n);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     (&this->filtration,(size_type)__n_00);
  if (fVar1 < *pvVar3) {
LAB_00189ba5:
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n_00);
    __end2 = std::vector<long,_std::allocator<long>_>::begin(pvVar4);
    i = (long)std::vector<long,_std::allocator<long>_>::end(pvVar4);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                       *)&i), bVar2) {
      psVar7 = (size_type *)
               __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&__end2);
      local_48 = *psVar7;
      psVar7 = (size_type *)
               std::vector<long,_std::allocator<long>_>::operator[](&this->parent,local_48);
      *psVar7 = (size_type)__n;
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end2);
    }
    pvVar8 = (vector<long,std::allocator<long>> *)
             std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n);
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n);
    local_58._M_current = (long *)std::vector<long,_std::allocator<long>_>::end(pvVar4);
    __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
    __normal_iterator<long*>
              ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_50,
               &local_58);
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n_00);
    iVar9 = std::vector<long,_std::allocator<long>_>::begin(pvVar4);
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n_00);
    iVar10 = std::vector<long,_std::allocator<long>_>::end(pvVar4);
    std::vector<long,std::allocator<long>>::
    insert<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
              (pvVar8,local_50,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               iVar9._M_current,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               iVar10._M_current);
    __n = std::vector<float,_std::allocator<float>_>::operator[]
                    (&this->filtration,(size_type)__n_00);
  }
  else {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&this->filtration,(size_type)__n);
    fVar1 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&this->filtration,(size_type)__n_00);
    if ((fVar1 == *pvVar3) && (!NAN(fVar1) && !NAN(*pvVar3))) {
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&this->rank,(size_type)__n);
      sVar5 = std::vector<long,_std::allocator<long>_>::size(pvVar4);
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&this->rank,(size_type)__n_00);
      sVar6 = std::vector<long,_std::allocator<long>_>::size(pvVar4);
      if (sVar6 < sVar5) goto LAB_00189ba5;
    }
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n);
    __end2_1 = std::vector<long,_std::allocator<long>_>::begin(pvVar4);
    i_1 = (long)std::vector<long,_std::allocator<long>_>::end(pvVar4);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)&i_1), bVar2) {
      psVar7 = (size_type *)
               __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&__end2_1);
      local_90 = *psVar7;
      psVar7 = (size_type *)
               std::vector<long,_std::allocator<long>_>::operator[](&this->parent,local_90);
      *psVar7 = (size_type)__n_00;
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end2_1);
    }
    pvVar8 = (vector<long,std::allocator<long>> *)
             std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n_00);
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n_00);
    local_a0._M_current = (long *)std::vector<long,_std::allocator<long>_>::end(pvVar4);
    __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
    __normal_iterator<long*>
              ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_98,
               &local_a0);
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n);
    iVar9 = std::vector<long,_std::allocator<long>_>::begin(pvVar4);
    pvVar4 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&this->rank,(size_type)__n);
    iVar10 = std::vector<long,_std::allocator<long>_>::end(pvVar4);
    std::vector<long,std::allocator<long>>::
    insert<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
              (pvVar8,local_98,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               iVar9._M_current,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               iVar10._M_current);
    __n = std::vector<float,_std::allocator<float>_>::operator[](&this->filtration,(size_type)__n);
  }
LAB_00189e57:
  return (int)__n;
}

Assistant:

value_t link(index_t x, index_t y) {
		x = find(x);
		y = find(y);
		if (x == y) return -1;
		if (filtration[x] < filtration[y] || (filtration[x] == filtration[y] && rank[x].size() > rank[y].size())){
			for(auto i : rank[y]) parent[i] = x;
			rank[x].insert(rank[x].end(),rank[y].begin(),rank[y].end());
			return filtration[y];
		} else {
			for(auto i : rank[x]) parent[i] = y;
			rank[y].insert(rank[y].end(),rank[x].begin(),rank[x].end());
			return filtration[x];
		}
	}